

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::InputFile::InputFile
          (InputFile *this,char *filename,ContextInitializer *ctxtinit,int numThreads)

{
  InputPartData *pIVar1;
  element_type *peVar2;
  Context **in_RDI;
  bool in_stack_0000001b;
  int in_stack_0000001c;
  ContextInitializer *in_stack_00000020;
  char *in_stack_00000028;
  MultiPartInputFile *in_stack_00000030;
  int in_stack_0000015c;
  MultiPartInputFile *in_stack_00000160;
  InputFile *in_stack_000001c0;
  pointer in_stack_ffffffffffffff88;
  Context *in_stack_ffffffffffffff90;
  Context *this_00;
  Context **__args;
  
  __args = in_RDI;
  Context::Context(in_stack_ffffffffffffff90);
  std::make_shared<Imf_3_4::InputFile::Data,Imf_3_4::Context*,int&>(__args,(int *)in_RDI);
  std::__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f5653);
  operator_new(0x20);
  MultiPartInputFile::MultiPartInputFile
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001c,
             in_stack_0000001b);
  std::unique_ptr<Imf_3_4::MultiPartInputFile,_std::default_delete<Imf_3_4::MultiPartInputFile>_>::
  reset((unique_ptr<Imf_3_4::MultiPartInputFile,_std::default_delete<Imf_3_4::MultiPartInputFile>_>
         *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f56a7);
  std::unique_ptr<Imf_3_4::MultiPartInputFile,_std::default_delete<Imf_3_4::MultiPartInputFile>_>::
  operator->((unique_ptr<Imf_3_4::MultiPartInputFile,_std::default_delete<Imf_3_4::MultiPartInputFile>_>
              *)0x1f56b3);
  pIVar1 = MultiPartInputFile::getPart(in_stack_00000160,in_stack_0000015c);
  this_00 = (Context *)(in_RDI + 2);
  peVar2 = std::
           __shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f56d7);
  peVar2->_part = pIVar1;
  std::__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f56ea);
  Context::operator=(this_00,&in_stack_ffffffffffffff88->_ctxt);
  initialize(in_stack_000001c0);
  return;
}

Assistant:

InputFile::InputFile (
    const char* filename, const ContextInitializer& ctxtinit, int numThreads)
    : _data (std::make_shared<Data> (&_ctxt, numThreads))
{
    _data->_mFile.reset (new MultiPartInputFile (filename, ctxtinit, numThreads, false));
    _data->_part = _data->_mFile->getPart (Data::kDefaultPart);
    _ctxt = _data->_part->context;

    initialize ();
}